

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_huffman_codes.cpp
# Opt level: O2

bool lzham::generate_huffman_codes
               (void *pContext,uint num_syms,uint16 *pFreq,uint8 *pCodesizes,uint *max_code_size,
               uint *total_freq_ret,code_size_histogram *code_size_hist)

{
  ushort uVar1;
  void *pvVar2;
  uint i_1;
  int iVar3;
  ulong uVar4;
  long lVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int *piVar11;
  int iVar12;
  uint *puVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  uint auStack_1438 [256];
  int x [1024];
  
  i_1 = num_syms - 1;
  if (i_1 < 0x400) {
    uVar22 = 0;
    uVar10 = 0;
    for (uVar4 = 0; uVar21 = (uint)uVar22, num_syms != uVar4; uVar4 = uVar4 + 1) {
      uVar1 = pFreq[uVar4];
      if (uVar1 == 0) {
        pCodesizes[uVar4] = '\0';
      }
      else {
        *(short *)((long)pContext + uVar22 * 8 + 4) = (short)uVar4;
        *(undefined2 *)((long)pContext + uVar22 * 8 + 6) = 0xffff;
        uVar10 = uVar10 + uVar1;
        *(uint *)((long)pContext + uVar22 * 8) = (uint)uVar1;
        uVar22 = (ulong)(uVar21 + 1);
      }
    }
    *total_freq_ret = uVar10;
    if (uVar21 == 1) {
      pCodesizes[*(ushort *)((long)pContext + 4)] = '\x01';
    }
    else {
      memset(x,0,0x800);
      uVar4 = (ulong)(uVar21 & 0xfffffffe);
      puVar13 = (uint *)pContext;
      for (lVar5 = (ulong)(uVar21 & 0xfffffffe) << 3; lVar5 != 0; lVar5 = lVar5 + -0x10) {
        uVar18 = *puVar13;
        uVar20 = puVar13[2];
        x[uVar18 & 0xff] = x[uVar18 & 0xff] + 1;
        piVar11 = (int *)((long)x + (ulong)(uVar18 >> 6 & 0x3fc) + 0x400);
        *piVar11 = *piVar11 + 1;
        x[uVar20 & 0xff] = x[uVar20 & 0xff] + 1;
        piVar11 = (int *)((long)x + (ulong)(uVar20 >> 6 & 0x3fc) + 0x400);
        *piVar11 = *piVar11 + 1;
        puVar13 = puVar13 + 4;
      }
      if ((uVar22 & 1) != 0) {
        uVar18 = *(uint *)((long)pContext + uVar4 * 8);
        x[uVar18 & 0xff] = x[uVar18 & 0xff] + 1;
        piVar11 = (int *)((long)x + (ulong)(uVar18 >> 6 & 0x3fc) + 0x400);
        *piVar11 = *piVar11 + 1;
      }
      piVar11 = x + 1;
      pvVar2 = (void *)((long)pContext + 0x4008);
      for (lVar5 = 0; pvVar6 = pvVar2, lVar5 != (ulong)(x[0x100] != uVar21) + 1; lVar5 = lVar5 + 1)
      {
        uVar18 = 0;
        for (uVar7 = 0; uVar7 < 0x100; uVar7 = uVar7 + 2) {
          auStack_1438[uVar7] = uVar18;
          iVar9 = piVar11[uVar7 - 1];
          auStack_1438[uVar7 + 1] = uVar18 + iVar9;
          uVar18 = uVar18 + iVar9 + piVar11[uVar7];
        }
        for (lVar8 = 0; (ulong)(uVar21 & 0xfffffffe) << 3 != lVar8; lVar8 = lVar8 + 0x10) {
          uVar18 = *(uint *)((long)pContext + lVar8 + 8);
          uVar20 = uVar18 >> 8;
          uVar19 = *(uint *)((long)pContext + lVar8) >> 8;
          if (lVar5 == 0) {
            uVar20 = uVar18;
            uVar19 = *(uint *)((long)pContext + lVar8);
          }
          uVar19 = uVar19 & 0xff;
          uVar20 = uVar20 & 0xff;
          uVar18 = auStack_1438[uVar19];
          if (uVar19 == uVar20) {
            auStack_1438[uVar19] = uVar18 + 2;
            *(undefined8 *)((long)pvVar6 + (ulong)uVar18 * 8) =
                 *(undefined8 *)((long)pContext + lVar8);
            uVar19 = uVar18 + 1;
          }
          else {
            auStack_1438[uVar19] = uVar18 + 1;
            uVar19 = auStack_1438[uVar20];
            auStack_1438[uVar20] = uVar19 + 1;
            *(undefined8 *)((long)pvVar6 + (ulong)uVar18 * 8) =
                 *(undefined8 *)((long)pContext + lVar8);
          }
          *(undefined8 *)((long)pvVar6 + (ulong)uVar19 * 8) =
               *(undefined8 *)((long)pContext + lVar8 + 8);
        }
        if ((uVar22 & 1) != 0) {
          uVar20 = *(uint *)((long)pContext + uVar4 * 8) >> ((char)lVar5 * '\b' & 0x1fU) & 0xff;
          uVar18 = auStack_1438[uVar20];
          auStack_1438[uVar20] = uVar18 + 1;
          *(undefined8 *)((long)pvVar6 + (ulong)uVar18 * 8) =
               *(undefined8 *)((long)pContext + uVar4 * 8);
        }
        piVar11 = piVar11 + 0x100;
        pvVar2 = pContext;
        pContext = pvVar6;
      }
      for (uVar4 = 0; uVar22 != uVar4; uVar4 = uVar4 + 1) {
        x[uVar4] = *(int *)((long)pContext + uVar4 * 8);
      }
      if (uVar21 != 0) {
        x[0] = x[0] + x[1];
        iVar3 = uVar21 - 1;
        iVar9 = 2;
        iVar12 = 0;
        for (lVar5 = 1; lVar5 < iVar3; lVar5 = lVar5 + 1) {
          lVar8 = (long)iVar12;
          if ((iVar9 < (int)uVar21) && (lVar17 = (long)iVar9, x[lVar17] <= x[lVar8])) {
            iVar9 = iVar9 + 1;
            x[lVar5] = x[lVar17];
          }
          else {
            x[lVar5] = x[lVar8];
            iVar12 = iVar12 + 1;
            x[lVar8] = (int)lVar5;
            lVar8 = (long)iVar12;
          }
          if (iVar9 < (int)uVar21) {
            if (lVar8 < lVar5) {
              iVar14 = x[lVar8];
              iVar16 = x[iVar9];
              if (iVar14 < iVar16) goto LAB_00105e80;
            }
            else {
              iVar16 = x[iVar9];
            }
            iVar9 = iVar9 + 1;
            x[lVar5] = x[lVar5] + iVar16;
          }
          else {
            iVar14 = x[lVar8];
LAB_00105e80:
            x[lVar5] = x[lVar5] + iVar14;
            iVar12 = iVar12 + 1;
            x[lVar8] = (int)lVar5;
          }
        }
        uVar18 = uVar21 - 2;
        x[(long)(int)uVar21 + -2] = 0;
        for (uVar21 = uVar21 - 3; -1 < (int)uVar21; uVar21 = uVar21 - 1) {
          x[uVar21] = x[x[uVar21]] + 1;
        }
        iVar12 = 0;
        iVar9 = 1;
        while (iVar9 != 0) {
          uVar21 = 0xffffffff;
          if ((int)uVar18 < -1) {
            uVar21 = uVar18;
          }
          iVar14 = uVar18 - uVar21;
          iVar16 = 0;
          for (; (uVar20 = uVar21, iVar15 = iVar14, iVar16 != iVar14 &&
                 (uVar20 = uVar18, iVar15 = iVar16, x[uVar18] == iVar12)); uVar18 = uVar18 - 1) {
            iVar16 = iVar16 + 1;
          }
          uVar18 = uVar20;
          piVar11 = x + iVar3;
          for (; iVar15 < iVar9; iVar9 = iVar9 + -1) {
            *piVar11 = iVar12;
            iVar3 = iVar3 + -1;
            piVar11 = piVar11 + -1;
          }
          iVar12 = iVar12 + 1;
          iVar9 = iVar15 * 2;
        }
      }
      uVar21 = 0;
      for (uVar4 = 0; uVar22 != uVar4; uVar4 = uVar4 + 1) {
        uVar18 = x[uVar4];
        if (uVar21 < uVar18) {
          uVar21 = uVar18;
        }
        uVar7 = 0x20;
        if (uVar18 < 0x20) {
          uVar7 = (ulong)uVar18;
        }
        code_size_hist->m_num_codes[uVar7] = code_size_hist->m_num_codes[uVar7] + 1;
        pCodesizes[*(ushort *)((long)pContext + uVar4 * 8 + 4)] = (uint8)uVar18;
      }
      *max_code_size = uVar21;
    }
  }
  return i_1 < 0x400;
}

Assistant:

bool generate_huffman_codes(void* pContext, uint num_syms, const uint16* pFreq, uint8* pCodesizes, uint& max_code_size, uint& total_freq_ret, code_size_histogram &code_size_hist)
   {
      if ((!num_syms) || (num_syms > cHuffmanMaxSupportedSyms))
         return false;
                  
      huffman_work_tables& state = *static_cast<huffman_work_tables*>(pContext);;
            
      uint max_freq = 0;
      uint total_freq = 0;
      
      uint num_used_syms = 0;
      for (uint i = 0; i < num_syms; i++)
      {
         uint freq = pFreq[i];
         
         if (!freq)
            pCodesizes[i] = 0;
         else
         {
            total_freq += freq;
            max_freq = math::maximum(max_freq, freq);
            
            sym_freq& sf = state.syms0[num_used_syms];
            sf.m_left = (uint16)i;
            sf.m_right = cUINT16_MAX;
            sf.m_freq = freq;
            num_used_syms++;
         }            
      }
      
      total_freq_ret = total_freq;

      if (num_used_syms == 1)
      {
         pCodesizes[state.syms0[0].m_left] = 1;
         return true;
      }

      sym_freq* syms = radix_sort_syms(num_used_syms, state.syms0, state.syms1);
      
      int x[cHuffmanMaxSupportedSyms];
      for (uint i = 0; i < num_used_syms; i++)
         x[i] = syms[i].m_freq;
      
      calculate_minimum_redundancy(x, num_used_syms);
      
      uint max_len = 0;
      for (uint i = 0; i < num_used_syms; i++)
      {
         uint len = x[i];
         max_len = math::maximum(len, max_len);
         code_size_hist.m_num_codes[LZHAM_MIN(len, (uint)code_size_histogram::cMaxUnlimitedHuffCodeSize)]++;
         pCodesizes[syms[i].m_left] = static_cast<uint8>(len);
      }
      max_code_size = max_len;
                  
      return true;
   }